

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

void __thiscall
cnn::Conv1DNarrow::forward_impl
          (Conv1DNarrow *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Index IVar5;
  Scalar *pSVar6;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0> *in_RDI;
  uint k;
  float t;
  uint j;
  uint i;
  uint fcols;
  uint ycols;
  uint rows;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> f;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  uint local_94;
  float fVar7;
  uint uVar8;
  uint uVar9;
  Tensor *in_stack_ffffffffffffff88;
  
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
  Tensor::operator*(in_stack_ffffffffffffff88);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
  Tensor::operator*(in_stack_ffffffffffffff88);
  Tensor::operator*(in_stack_ffffffffffffff88);
  IVar5 = Eigen::
          MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
          rows(in_RDI);
  uVar2 = (uint)IVar5;
  uVar3 = Dim::cols((Dim *)&in_RDI[1].m_rows);
  IVar5 = Eigen::
          MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
          cols((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)0x527635);
  uVar4 = (uint)IVar5;
  for (uVar9 = 0; uVar9 < uVar2; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; uVar8 < uVar3; uVar8 = uVar8 + 1) {
      fVar7 = 0.0;
      for (local_94 = 0; local_94 < uVar4; local_94 = local_94 + 1) {
        pSVar6 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               *)CONCAT44(uVar2,uVar3),CONCAT44(uVar4,uVar9),CONCAT44(uVar8,fVar7));
        fVar1 = *pSVar6;
        pSVar6 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               *)CONCAT44(uVar2,uVar3),CONCAT44(uVar4,uVar9),CONCAT44(uVar8,fVar7));
        fVar7 = fVar1 * *pSVar6 + fVar7;
      }
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)CONCAT44(uVar2,uVar3),CONCAT44(uVar4,uVar9),CONCAT44(uVar8,fVar7));
      *pSVar6 = fVar7;
    }
  }
  return;
}

Assistant:

void Conv1DNarrow::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Conv1DNarrow::forward not implemented for CUDA");
#else
  // TODO this is a bad implementation- rewrite to use unsupported Eigen tensor library
  auto x = **xs[0];  // input
  auto f = **xs[1];  // filter
  auto y = *fx;
  const unsigned rows = x.rows();
  const unsigned ycols = dim.cols();
  const unsigned fcols = f.cols();
  for (unsigned i = 0; i < rows; ++i) {
    for (unsigned j = 0; j < ycols; ++j) {
      float t = 0;
      for (unsigned k = 0; k < fcols; ++k)
        t += f(i, k) * x(i, j + k);
      y(i, j) = t;
    }
  }
#endif
}